

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkBalance(Abc_Ntk_t *pNtk,int fDuplicate,int fSelective,int fUpdateLevel)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pNtkAig;
  int fUpdateLevel_local;
  int fSelective_local;
  int fDuplicate_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                  ,0x39,"Abc_Ntk_t *Abc_NtkBalance(Abc_Ntk_t *, int, int, int)");
  }
  if (fSelective != 0) {
    Abc_NtkStartReverseLevels(pNtk,0);
    Abc_NtkMarkCriticalNodes(pNtk);
  }
  pNtk_local = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
  Abc_NtkBalancePerform(pNtk,pNtk_local,fDuplicate,fSelective,fUpdateLevel);
  Abc_NtkFinalize(pNtk,pNtk_local);
  Abc_AigCleanup((Abc_Aig_t *)pNtk_local->pManFunc);
  if (fSelective != 0) {
    Abc_NtkStopReverseLevels(pNtk);
    Abc_NtkCleanMarkA(pNtk);
  }
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    pAVar2 = Abc_NtkDup(pNtk->pExdc);
    pNtk_local->pExdc = pAVar2;
  }
  iVar1 = Abc_NtkCheck(pNtk_local);
  if (iVar1 == 0) {
    printf("Abc_NtkBalance: The network check has failed.\n");
    Abc_NtkDelete(pNtk_local);
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkBalance( Abc_Ntk_t * pNtk, int fDuplicate, int fSelective, int fUpdateLevel )
{
//    extern void Abc_NtkHaigTranfer( Abc_Ntk_t * pNtkOld, Abc_Ntk_t * pNtkNew );
    Abc_Ntk_t * pNtkAig;
    assert( Abc_NtkIsStrash(pNtk) );
    // compute the required times
    if ( fSelective )
    {
        Abc_NtkStartReverseLevels( pNtk, 0 );
        Abc_NtkMarkCriticalNodes( pNtk );
    }
    // perform balancing
    pNtkAig = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // transfer HAIG
//    Abc_NtkHaigTranfer( pNtk, pNtkAig );
    // perform balancing
    Abc_NtkBalancePerform( pNtk, pNtkAig, fDuplicate, fSelective, fUpdateLevel );
    Abc_NtkFinalize( pNtk, pNtkAig );
    Abc_AigCleanup( (Abc_Aig_t *)pNtkAig->pManFunc );
    // undo the required times
    if ( fSelective )
    {
        Abc_NtkStopReverseLevels( pNtk );
        Abc_NtkCleanMarkA( pNtk );
    }
    if ( pNtk->pExdc )
        pNtkAig->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkBalance: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
//Abc_NtkPrintCiLevels( pNtkAig );
    return pNtkAig;
}